

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::Persistence_landscape::new_abs(Persistence_landscape *this)

{
  double dVar1;
  double dVar2;
  pointer pvVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  Persistence_landscape *this_00;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  pair<double,_double> p1;
  pair<double,_double> p2;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  pair<double,_double> local_78;
  value_type local_68;
  long local_48;
  double local_40;
  Persistence_landscape *local_38;
  
  this_00 = (Persistence_landscape *)operator_new(0x28);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            *)this_00,&this->land);
  sVar5 = this->number_of_functions_for_projections_to_reals;
  this_00->number_of_functions_for_vectorization = this->number_of_functions_for_vectorization;
  this_00->number_of_functions_for_projections_to_reals = sVar5;
  if ((this->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_48 = 0;
    local_38 = this_00;
    do {
      if (AbsDbg == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"level: ",7);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_double> *)0x0;
      local_78.first = -2147483647.0;
      local_78.second = 0.0;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_68,(iterator)0x0,&local_78);
      lVar6 = local_48;
      pvVar3 = (this->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)*(pointer *)
                 ((long)&pvVar3[local_48].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl + 8) -
          *(long *)&pvVar3[local_48].
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl != 0x10) {
        lVar8 = 1;
        lVar9 = 0;
        do {
          if (AbsDbg == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,"this->land[",0xb);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"][",2);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] : ",4);
            poVar7 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)&(this->land).
                                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl + 0x10 + lVar9));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)&(this->land).
                                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl + 0x18 + lVar9));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          pvVar3 = (this->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = *(long *)&pvVar3[lVar6].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl;
          dVar1 = *(double *)(lVar4 + 8 + lVar9);
          dVar2 = *(double *)(lVar4 + 0x18 + lVar9);
          if (0.0 <= dVar1 * dVar2) {
            lVar4 = *(long *)&pvVar3[lVar6].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl;
            local_78.first = *(double *)(lVar4 + 0x10 + lVar9);
            local_78.second = ABS(*(double *)(lVar4 + 0x18 + lVar9));
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (AbsDbg == '\x01') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"Adding pair : (",0xf);
              poVar7 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   (*(long *)&(this->land).
                                              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                              ._M_impl + 0x10 + lVar9));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
              poVar7 = std::ostream::_M_insert<double>
                                 (ABS(*(double *)
                                       (*(long *)&(this->land).
                                                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                                  ._M_impl + 0x18 + lVar9)));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::istream::ignore();
            }
          }
          else {
            p1.second = dVar1;
            p1.first = *(double *)(lVar4 + lVar9);
            p2.second = dVar2;
            p2.first = *(double *)(lVar4 + 0x10 + lVar9);
            local_78.first = find_zero_of_a_line_segment_between_those_two_points(p1,p2);
            local_78.second = 0.0;
            local_40 = local_78.first;
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar4 = *(long *)&(this->land).
                              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar6].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl;
            local_78.first = *(double *)(lVar4 + 0x10 + lVar9);
            local_78.second = ABS(*(double *)(lVar4 + 0x18 + lVar9));
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (AbsDbg == '\x01') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"Adding pair : (",0xf);
              poVar7 = std::ostream::_M_insert<double>(local_40);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,",0)",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"In the same step adding pair : (",0x20);
              poVar7 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   (*(long *)&(this->land).
                                              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                              ._M_impl + 0x10 + lVar9));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
              poVar7 = std::ostream::_M_insert<double>
                                 (ABS(*(double *)
                                       (*(long *)&(this->land).
                                                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                                  ._M_impl + 0x18 + lVar9)));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::istream::ignore();
            }
          }
          pvVar3 = (this->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar8 != (long)*(pointer *)
                                 ((long)&pvVar3[lVar6].
                                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                         ._M_impl + 8) -
                          *(long *)&pvVar3[lVar6].
                                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                    ._M_impl >> 4);
      }
      this_00 = local_38;
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::push_back(&local_38->land,&local_68);
      if (local_68.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_48 = local_48 + 1;
    } while (local_48 !=
             ((long)(this->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  return this_00;
}

Assistant:

Persistence_landscape* Persistence_landscape::new_abs() {
  Persistence_landscape* result = new Persistence_landscape(*this);
  for (size_t level = 0; level != this->land.size(); ++level) {
    if (AbsDbg) {
      std::clog << "level: " << level << std::endl;
    }
    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    for (size_t i = 1; i != this->land[level].size(); ++i) {
      if (AbsDbg) {
        std::clog << "this->land[" << level << "][" << i << "] : " << this->land[level][i].first << " "
                  << this->land[level][i].second << std::endl;
      }
      // if a line segment between this->land[level][i-1] and this->land[level][i] crosses the x-axis, then we have to
      // add one landscape point t o result
      if ((this->land[level][i - 1].second) * (this->land[level][i].second) < 0) {
        double zero =
            find_zero_of_a_line_segment_between_those_two_points(this->land[level][i - 1], this->land[level][i]);

        lambda_n.push_back(std::make_pair(zero, 0));
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << zero << ",0)" << std::endl;
          std::clog << "In the same step adding pair : (" << this->land[level][i].first << ","
                    << fabs(this->land[level][i].second) << ") " << std::endl;
          std::cin.ignore();
        }
      } else {
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << this->land[level][i].first << "," << fabs(this->land[level][i].second)
                    << ") " << std::endl;
          std::cin.ignore();
        }
      }
    }
    result->land.push_back(lambda_n);
  }
  return result;
}